

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O2

Fxch_Man_t * Fxch_ManStart(Vec_Wec_t *vCubes,Vec_Wec_t *vLits)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Fxch_Man_t *pFVar5;
  Vec_Int_t *pVVar6;
  Fxch_Obj_t *pFVar7;
  ulong uVar8;
  ulong uVar9;
  
  pFVar5 = (Fxch_Man_t *)calloc(1,0xe8);
  iVar2 = vCubes->nSize;
  pVVar6 = vCubes->pArray;
  (pFVar5->vCubes).nCap = vCubes->nCap;
  (pFVar5->vCubes).nSize = iVar2;
  (pFVar5->vCubes).pArray = pVVar6;
  iVar2 = vLits->nSize;
  pVVar6 = vLits->pArray;
  (pFVar5->vLits).nCap = vLits->nCap;
  (pFVar5->vLits).nSize = iVar2;
  (pFVar5->vLits).pArray = pVVar6;
  iVar2 = vLits->nSize / 2;
  pFVar5->nVars = iVar2;
  Gia_ManRandom(1);
  Vec_IntGrow(&pFVar5->vRands,iVar2 * 2);
  for (iVar2 = 0; iVar2 < pFVar5->nVars * 2; iVar2 = iVar2 + 1) {
    uVar3 = Gia_ManRandom(0);
    Vec_IntPush(&pFVar5->vRands,uVar3 & 0x3ffffff);
  }
  Vec_IntGrow(&pFVar5->vCubeLinks,(pFVar5->vCubes).nSize);
  for (iVar2 = 0; iVar2 < vCubes->nSize; iVar2 = iVar2 + 1) {
    pVVar6 = Vec_WecEntry(vCubes,iVar2);
    Vec_IntPush(&pFVar5->vCubeLinks,pFVar5->nLits + 1);
    pFVar5->nLits = pFVar5->nLits + pVVar6->nSize;
  }
  if ((pFVar5->vCubeLinks).nSize != (pFVar5->vCubes).nSize) {
    __assert_fail("Vec_IntSize(&p->vCubeLinks) == Vec_WecSize(&p->vCubes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0xb8,"Fxch_Man_t *Fxch_ManStart(Vec_Wec_t *, Vec_Wec_t *)");
  }
  uVar1 = pFVar5->nLits;
  uVar3 = uVar1 + 1;
  if (1 < uVar3) {
    uVar3 = 0;
    for (uVar4 = uVar1; uVar4 != 0; uVar4 = uVar4 >> 1) {
      uVar3 = uVar3 + 1;
    }
    if (0x1a < uVar3) {
      __assert_fail("LogSize <= 26",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                    ,0xbb,"Fxch_Man_t *Fxch_ManStart(Vec_Wec_t *, Vec_Wec_t *)");
    }
  }
  uVar3 = 1 << ((byte)uVar3 & 0x1f);
  iVar2 = uVar3 - 1;
  pFVar5->SizeMask = iVar2;
  pFVar7 = (Fxch_Obj_t *)calloc((ulong)uVar3,0x10);
  pFVar5->pBins = pFVar7;
  if ((int)uVar1 < iVar2) {
    Vec_FltGrow(&pFVar5->vWeights,1000);
    Vec_FltPush(&pFVar5->vWeights,-1.0);
    Vec_WecGrow(&pFVar5->vPairs,1000);
    Vec_WecPushLevel(&pFVar5->vPairs);
    Vec_WrdGrow(&pFVar5->vDivs,pFVar5->nVars + 1000);
    uVar3 = pFVar5->nVars;
    Vec_WrdGrow(&pFVar5->vDivs,uVar3);
    uVar8 = 0;
    uVar9 = 0;
    if (0 < (int)uVar3) {
      uVar9 = (ulong)uVar3;
    }
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      (pFVar5->vDivs).pArray[uVar8] = 0;
    }
    (pFVar5->vDivs).nSize = uVar3;
    return pFVar5;
  }
  __assert_fail("p->nLits+1 < p->SizeMask+1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                ,0xbe,"Fxch_Man_t *Fxch_ManStart(Vec_Wec_t *, Vec_Wec_t *)");
}

Assistant:

Fxch_Man_t * Fxch_ManStart( Vec_Wec_t * vCubes, Vec_Wec_t * vLits )
{
    Vec_Int_t * vCube;  int i, LogSize;
    Fxch_Man_t * p = ABC_CALLOC( Fxch_Man_t, 1 );
    p->vCubes = *vCubes;
    p->vLits  = *vLits;
    p->nVars  = Vec_WecSize(vLits)/2;
    p->nLits  = 0;
    // random numbers
    Gia_ManRandom( 1 );
    Vec_IntGrow( &p->vRands, 2*p->nVars );
    for ( i = 0; i < 2*p->nVars; i++ )
        Vec_IntPush( &p->vRands, Gia_ManRandom(0) & 0x3FFFFFF ); // assert( LogSize <= 26 );
    // create cube links
    Vec_IntGrow( &p->vCubeLinks, Vec_WecSize(&p->vCubes) );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        Vec_IntPush( &p->vCubeLinks, p->nLits+1 );
        p->nLits += Vec_IntSize(vCube);
    }
    assert( Vec_IntSize(&p->vCubeLinks) == Vec_WecSize(&p->vCubes) );
    // create table
    LogSize = Abc_Base2Log( p->nLits+1 );
    assert( LogSize <= 26 );
    p->SizeMask = (1 << LogSize) - 1;
    p->pBins = ABC_CALLOC( Fxch_Obj_t, p->SizeMask + 1 );
    assert( p->nLits+1 < p->SizeMask+1 );
    // divisor weights and cube pairs
    Vec_FltGrow( &p->vWeights, 1000 );
    Vec_FltPush( &p->vWeights, -1 );
    Vec_WecGrow( &p->vPairs, 1000 );
    Vec_WecPushLevel( &p->vPairs );
    // prepare divisors
    Vec_WrdGrow( &p->vDivs, p->nVars + 1000 );
    Vec_WrdFill( &p->vDivs, p->nVars, 0 );
    return p;
}